

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmLocalNinjaGenerator::Generate(cmLocalNinjaGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  string *remote_path;
  cmGeneratedFileStream *pcVar4;
  cmMakefile *this_00;
  _Base_ptr p_Var5;
  ulong uVar6;
  ostream *poVar7;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_01;
  __uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_> *p_Var8;
  pointer pcVar9;
  cmGlobalNinjaGenerator *pcVar10;
  undefined1 local_c0 [8];
  unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_> tg;
  cmGeneratorTarget *target;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range1;
  string local_90;
  allocator<char> local_59;
  string local_58;
  _Base_ptr local_38;
  string *showIncludesPrefix;
  cmLocalNinjaGenerator *local_10;
  cmLocalNinjaGenerator *this_local;
  
  local_10 = this;
  psVar3 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  remote_path = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmLocalGenerator::MaybeConvertToRelativePath
            ((string *)&showIncludesPrefix,(cmLocalGenerator *)this,psVar3,remote_path);
  std::__cxx11::string::operator=
            ((string *)&this->HomeRelativeOutputPath,(string *)&showIncludesPrefix);
  std::__cxx11::string::~string((string *)&showIncludesPrefix);
  bVar1 = std::operator==(&this->HomeRelativeOutputPath,".");
  if (bVar1) {
    std::__cxx11::string::clear();
  }
  pcVar4 = GetBuildFileStream(this);
  WriteProcessedMakefile(this,(ostream *)pcVar4);
  bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
  if (bVar1) {
    WriteBuildFileTop(this);
    pcVar4 = GetRulesFileStream(this);
    WritePools(this,(ostream *)pcVar4);
    this_00 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"CMAKE_CL_SHOWINCLUDES_PREFIX",&local_59);
    p_Var5 = (_Base_ptr)cmMakefile::GetSafeDefinition(this_00,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    local_38 = p_Var5;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      pcVar4 = GetRulesFileStream(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"localized /showIncludes string",
                 (allocator<char> *)((long)&__range1 + 7));
      cmGlobalNinjaGenerator::WriteComment((ostream *)pcVar4,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      pcVar4 = GetRulesFileStream(this);
      poVar7 = std::operator<<((ostream *)pcVar4,"msvc_deps_prefix = ");
      poVar7 = std::operator<<(poVar7,(string *)local_38);
      std::operator<<(poVar7,"\n\n");
    }
  }
  this_01 = cmLocalGenerator::GetGeneratorTargets((cmLocalGenerator *)this);
  __end1 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_01);
  target = (cmGeneratorTarget *)
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                     *)&target), bVar1) {
    p_Var8 = (__uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
              *)__gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&__end1);
    tg._M_t.
    super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>._M_t
    .super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>.
    super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>._M_head_impl =
         *(__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
           *)&p_Var8->_M_t;
    TVar2 = cmGeneratorTarget::GetType
                      ((cmGeneratorTarget *)
                       tg._M_t.
                       super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                       .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>._M_head_impl);
    if (TVar2 != INTERFACE_LIBRARY) {
      cmNinjaTargetGenerator::New
                ((cmNinjaTargetGenerator *)local_c0,
                 (cmGeneratorTarget *)
                 tg._M_t.
                 super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                 .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>._M_head_impl);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_c0);
      if (bVar1) {
        pcVar9 = std::
                 unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>::
                 operator->((unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                             *)local_c0);
        (*(pcVar9->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])();
        pcVar10 = GetGlobalNinjaGenerator(this);
        bVar1 = cmGlobalNinjaGenerator::IsExcluded
                          (pcVar10,(cmGeneratorTarget *)
                                   tg._M_t.
                                   super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                                   .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>.
                                   _M_head_impl);
        if (!bVar1) {
          pcVar10 = GetGlobalNinjaGenerator(this);
          cmGlobalNinjaGenerator::AddDependencyToAll
                    (pcVar10,(cmGeneratorTarget *)
                             tg._M_t.
                             super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                             .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>._M_head_impl);
        }
      }
      std::unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>::
      ~unique_ptr((unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                   *)local_c0);
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&__end1);
  }
  WriteCustomCommandBuildStatements(this);
  AdditionalCleanFiles(this);
  return;
}

Assistant:

void cmLocalNinjaGenerator::Generate()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath = this->MaybeConvertToRelativePath(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory());
  if (this->HomeRelativeOutputPath == ".") {
    this->HomeRelativeOutputPath.clear();
  }

  this->WriteProcessedMakefile(this->GetBuildFileStream());
#ifdef NINJA_GEN_VERBOSE_FILES
  this->WriteProcessedMakefile(this->GetRulesFileStream());
#endif

  // We do that only once for the top CMakeLists.txt file.
  if (this->IsRootMakefile()) {
    this->WriteBuildFileTop();

    this->WritePools(this->GetRulesFileStream());

    const std::string& showIncludesPrefix =
      this->GetMakefile()->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
    if (!showIncludesPrefix.empty()) {
      cmGlobalNinjaGenerator::WriteComment(this->GetRulesFileStream(),
                                           "localized /showIncludes string");
      this->GetRulesFileStream()
        << "msvc_deps_prefix = " << showIncludesPrefix << "\n\n";
    }
  }

  for (cmGeneratorTarget* target : this->GetGeneratorTargets()) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    auto tg = cmNinjaTargetGenerator::New(target);
    if (tg) {
      tg->Generate();
      // Add the target to "all" if required.
      if (!this->GetGlobalNinjaGenerator()->IsExcluded(target)) {
        this->GetGlobalNinjaGenerator()->AddDependencyToAll(target);
      }
    }
  }

  this->WriteCustomCommandBuildStatements();
  this->AdditionalCleanFiles();
}